

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O0

int shm_queue_push_begin(QcShmQue *shmQue,int *idx,char **pp_buff,int *p_bufflen,QcErr *err)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  off_t buf_offset;
  int index;
  QcErr *err_local;
  int *p_bufflen_local;
  char **pp_buff_local;
  int *idx_local;
  QcShmQue *shmQue_local;
  
  qc_sem_wait(shmQue->sem_lst,-1);
  iVar2 = qc_staticlist_count(&shmQue->p_shmQue->lst_free);
  if (iVar2 == 0) {
    qc_seterr(err,-1,"alloc failed, no free unit in queue(%s).",shmQue->p_shmQue);
    qc_sem_post(shmQue->sem_lst);
    shmQue_local._4_4_ = -1;
  }
  else {
    iVar2 = qc_staticlist_get_head(&shmQue->p_shmQue->lst_free);
    if ((iVar2 < 0) &&
       (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
                ,0xfa), iVar2 < 0)) {
      __assert_fail("index>=0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
                    ,0xfa,"int shm_queue_push_begin(QcShmQue *, int *, char **, int *, QcErr *)");
    }
    qc_sem_post(shmQue->sem_lst);
    *idx = iVar2;
    iVar1 = shmQue->p_shmQue->msg_size;
    pcVar3 = qc_shm_getaddr(shmQue->qcShm);
    *pp_buff = pcVar3 + ((long)iVar1 + 8) * (long)iVar2 + shmQue->p_shmQue->data_offset;
    *p_bufflen = shmQue->p_shmQue->msg_size;
    *(int *)*pp_buff = shmQue->p_shmQue->msg_size;
    *pp_buff = *pp_buff + 8;
    shmQue_local._4_4_ = 0;
  }
  return shmQue_local._4_4_;
}

Assistant:

int shm_queue_push_begin(QcShmQue* shmQue, int *idx, char **pp_buff, int *p_bufflen, QcErr *err)
{
    int index;
    off_t buf_offset;

    qc_sem_wait(shmQue->sem_lst, -1);

	if (0 == qc_staticlist_count(&shmQue->p_shmQue->lst_free))
	{
		qc_seterr(err, -1, "alloc failed, no free unit in queue(%s).", shmQue->p_shmQue->quename);
        qc_sem_post(shmQue->sem_lst);
        return -1;
	}

    index = qc_staticlist_get_head(&shmQue->p_shmQue->lst_free);
	qc_assert(index>=0);

    qc_sem_post(shmQue->sem_lst);

    *idx = index;
    buf_offset = (sizeof(off_t) + shmQue->p_shmQue->msg_size) * index;
    *pp_buff = (char*)qc_shm_getaddr(shmQue->qcShm) + shmQue->p_shmQue->data_offset + buf_offset;
    *p_bufflen = shmQue->p_shmQue->msg_size;
    *((int*)*pp_buff) = shmQue->p_shmQue->msg_size;
    *pp_buff += sizeof(off_t);

    return 0;
}